

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

size_t __thiscall
MemoryLeakDetectorList::getTotalLeaks(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  MemoryLeakDetectorList MVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = 0;
  while (MVar1.head_ = this->head_, MVar1.head_ != (MemoryLeakDetectorNode *)0x0) {
    uVar3 = 1;
    if ((period != mem_leak_period_all) && (*(MemLeakPeriod *)(MVar1.head_ + 0x30) != period)) {
      uVar3 = (ulong)(*(MemLeakPeriod *)(MVar1.head_ + 0x30) != mem_leak_period_disabled &&
                     period == mem_leak_period_enabled);
    }
    sVar2 = sVar2 + uVar3;
    this = (MemoryLeakDetectorList *)(MVar1.head_ + 0x38);
  }
  return sVar2;
}

Assistant:

size_t MemoryLeakDetectorList::getTotalLeaks(MemLeakPeriod period)
{
    size_t total_leaks = 0;
    for (MemoryLeakDetectorNode* node = head_; node; node = node->next_) {
        if (isInPeriod(node, period)) total_leaks++;
    }
    return total_leaks;
}